

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::anon_unknown_0::_is_scalar_next__rmap(anon_unknown_0 *this,csubstr s)

{
  anon_unknown_0 aVar1;
  long lVar2;
  char *pcVar3;
  
  pcVar3 = s.str;
  if (pcVar3 < (char *)0x2) {
    if (pcVar3 == (char *)0x0) {
      return true;
    }
  }
  else {
    aVar1 = *this;
    if (aVar1 != (anon_unknown_0)0x3a) goto LAB_0022be95;
    if (this[1] == (anon_unknown_0)0x20) {
      return false;
    }
  }
  aVar1 = *this;
LAB_0022be95:
  lVar2 = 0;
  do {
    if (aVar1 == *(anon_unknown_0 *)("#,!&" + lVar2)) {
      return false;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (aVar1 == (anon_unknown_0)0x3f && (char *)0x1 < pcVar3) {
    return this[1] != (anon_unknown_0)0x20;
  }
  return true;
}

Assistant:

bool begins_with(ro_substr pattern) const
    {
        if(len < pattern.len)
        {
            return false;
        }
        for(size_t i = 0; i < pattern.len; ++i)
        {
            if(str[i] != pattern[i])
            {
                return false;
            }
        }
        return true;
    }